

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_value.h
# Opt level: O3

bool Potassco::ProgramOptions::FlagAction::store_false(string *v,bool *b)

{
  byte bVar1;
  int iVar2;
  bool temp;
  char *end;
  bool local_11;
  char *local_10;
  
  if (v->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = Potassco::xconvert((v->_M_dataplus)._M_p,&local_11,&local_10,0);
    if ((iVar2 == 0) || (*local_10 != '\0')) {
      return false;
    }
    bVar1 = local_11 ^ 1;
  }
  *b = (bool)bVar1;
  return true;
}

Assistant:

static inline bool store_false(const std::string& v, bool& b) {
		bool temp;
		return store_true(v, temp) && ((b = !temp), true);
	}